

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O3

bool __thiscall
llbuild::buildsystem::ShellCommand::processDependencyInfoDiscoveredDependencies
          (ShellCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context,
          StringRef depsPath,MemoryBuffer *input)

{
  bool bVar1;
  DependencyInfoParser local_68;
  ParseActions local_50;
  BuildSystem *local_48;
  void *local_40;
  void *local_38;
  ShellCommand *local_30;
  char *local_28;
  size_t sStack_20;
  int local_18;
  
  local_38 = ti.ctx;
  local_40 = ti.impl;
  local_28 = depsPath.Data;
  sStack_20 = depsPath.Length;
  local_50._vptr_ParseActions = (_func_int **)&PTR__ParseActions_0020c490;
  local_18 = 0;
  local_68.data.Data = input->BufferStart;
  local_68.data.Length = (long)input->BufferEnd - (long)local_68.data.Data;
  local_68.actions = &local_50;
  local_48 = system;
  local_30 = this;
  llbuild::core::DependencyInfoParser::parse(&local_68);
  bVar1 = local_18 == 0;
  llbuild::core::DependencyInfoParser::ParseActions::~ParseActions(&local_50);
  return bVar1;
}

Assistant:

bool
ShellCommand::processDependencyInfoDiscoveredDependencies(BuildSystem& system,
                                                          TaskInterface ti,
                                                          QueueJobContext* context,
                                                          StringRef depsPath,
                                                          llvm::MemoryBuffer* input) {
  // Parse the output.
  //
  // We just ignore the rule, and add any dependency that we encounter in the
  // file.
  struct DepsActions : public core::DependencyInfoParser::ParseActions {
    BuildSystem& system;
    TaskInterface ti;
    ShellCommand* command;
    StringRef depsPath;
    unsigned numErrors{0};

    DepsActions(BuildSystem& system, TaskInterface ti,
                ShellCommand* command, StringRef depsPath)
        : system(system), ti(ti), command(command), depsPath(depsPath) {}

    virtual void error(const char* message, uint64_t position) override {
      system.getDelegate().commandHadError(
          command, ("error reading dependency file '" + depsPath.str() +
                    "': " + std::string(message)));
      ++numErrors;
    }

    // Ignore everything but actual inputs.
    virtual void actOnVersion(StringRef) override { }
    virtual void actOnMissing(StringRef path) override {
      system.getDelegate().commandFoundDiscoveredDependency(command, path, DiscoveredDependencyKind::Missing);
    }
    virtual void actOnOutput(StringRef path) override {
      system.getDelegate().commandFoundDiscoveredDependency(command, path, DiscoveredDependencyKind::Output);
    }
    virtual void actOnInput(StringRef path) override {
      ti.discoveredDependency(BuildKey::makeNode(path).toData());
      system.getDelegate().commandFoundDiscoveredDependency(command, path, DiscoveredDependencyKind::Input);
    }
  };

  DepsActions actions(system, ti, this, depsPath);
  core::DependencyInfoParser(input->getBuffer(), actions).parse();
  return actions.numErrors == 0;
}